

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# train.c
# Opt level: O1

void read_problem(char *filename)

{
  feature_node **ppfVar1;
  FILE *__stream;
  char *pcVar2;
  char *__nptr;
  ushort **ppuVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  char *unaff_R14;
  int iVar9;
  char *unaff_R15;
  double dVar10;
  char *endptr;
  double dStack_80;
  undefined8 uStack_78;
  char *pcStack_70;
  char *pcStack_68;
  code *pcStack_60;
  long local_58;
  char *local_50;
  int *local_48;
  FILE *local_40;
  char *local_38;
  
  pcStack_60 = (code *)0x102b0b;
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
LAB_00102eb9:
    pcStack_60 = do_find_parameter_C;
    read_problem_cold_6();
    dVar10 = param.C;
    if (flag_C_specified == 0) {
      dVar10 = -1.0;
    }
    pcStack_70 = filename;
    pcStack_68 = unaff_R14;
    pcStack_60 = (code *)unaff_R15;
    printf("Doing parameter search with %d-fold cross validation.\n",(ulong)(uint)nr_fold);
    find_parameter_C(dVar10,0x4090000000000000,&prob,&param,nr_fold,&uStack_78,&dStack_80);
    printf("Best C = %lf  CV accuracy = %g%%\n",uStack_78,dStack_80 * 100.0);
    return;
  }
  prob.l = 0;
  max_line_len = 0x400;
  pcStack_60 = (code *)0x102b35;
  line = (char *)malloc(0x400);
  pcStack_60 = (code *)0x102b44;
  pcVar2 = readline((FILE *)__stream);
  unaff_R14 = (char *)0x0;
  lVar6 = 0;
  while (pcVar2 != (char *)0x0) {
    pcStack_60 = (code *)0x102b63;
    strtok(line," \t");
    while( true ) {
      pcStack_60 = (code *)0x102b6d;
      pcVar2 = strtok((char *)0x0," \t");
      if ((pcVar2 == (char *)0x0) || (*pcVar2 == '\n')) break;
      lVar6 = lVar6 + 1;
    }
    lVar6 = lVar6 + 1;
    prob.l = prob.l + 1;
    pcStack_60 = (code *)0x102b8d;
    pcVar2 = readline((FILE *)__stream);
  }
  pcStack_60 = (code *)0x102b9a;
  rewind(__stream);
  prob.bias = bias;
  unaff_R15 = (char *)(long)prob.l;
  pcStack_60 = (code *)0x102bc1;
  prob.y = (double *)malloc((long)unaff_R15 * 8);
  pcStack_60 = (code *)0x102bd0;
  prob.x = (feature_node **)malloc((long)unaff_R15 * 8);
  pcStack_60 = (code *)0x102be6;
  x_space = (feature_node *)malloc((long)(unaff_R15 + lVar6) * 0x10);
  if (prob.l < 1) {
    pcVar2 = (char *)0x0;
  }
  else {
    lVar6 = 0;
    unaff_R14 = (char *)0x0;
    filename = (char *)0x0;
    local_40 = __stream;
    do {
      pcStack_60 = (code *)0x102c12;
      readline((FILE *)local_40);
      lVar8 = (long)filename * 0x10;
      prob.x[lVar6] = x_space + (long)filename;
      pcStack_60 = (code *)0x102c41;
      __nptr = strtok(line," \t\n");
      if (__nptr == (char *)0x0) {
LAB_00102eb1:
        pcStack_60 = (code *)0x102eb9;
        read_problem_cold_5();
        goto LAB_00102eb9;
      }
      pcStack_60 = (code *)0x102c5a;
      dVar10 = strtod(__nptr,&local_50);
      prob.y[lVar6] = dVar10;
      local_58 = lVar6;
      if ((local_50 == __nptr) || (*local_50 != '\0')) {
LAB_00102ea8:
        pcStack_60 = (code *)0x102eb1;
        read_problem_cold_4();
        unaff_R15 = __nptr;
        goto LAB_00102eb1;
      }
      __nptr = (char *)0x0;
      pcStack_60 = (code *)0x102c98;
      local_38 = unaff_R14;
      pcVar2 = strtok((char *)0x0,":");
      pcStack_60 = (code *)0x102ca9;
      unaff_R14 = strtok((char *)0x0," \t");
      if (unaff_R14 != (char *)0x0) {
        pcStack_60 = (code *)0x102cba;
        local_48 = __errno_location();
        iVar7 = 0;
        do {
          *local_48 = 0;
          pcStack_60 = (code *)0x102cde;
          __nptr = (char *)strtol(pcVar2,&local_50,10);
          iVar9 = (int)__nptr;
          *(int *)((long)&x_space->index + lVar8) = iVar9;
          if (iVar9 <= iVar7) {
LAB_00102e9a:
            pcStack_60 = (code *)0x102ea8;
            read_problem_cold_1();
            goto LAB_00102ea8;
          }
          if (((local_50 == pcVar2) || (*local_48 != 0)) || (*local_50 != '\0')) {
            pcStack_60 = (code *)0x102e91;
            read_problem_cold_3();
LAB_00102e91:
            pcStack_60 = (code *)0x102e9a;
            read_problem_cold_2();
            goto LAB_00102e9a;
          }
          *local_48 = 0;
          pcStack_60 = (code *)0x102d32;
          dVar10 = strtod(unaff_R14,&local_50);
          *(double *)((long)&x_space->value + lVar8) = dVar10;
          if ((local_50 == unaff_R14) || (*local_48 != 0)) goto LAB_00102e91;
          unaff_R14 = (char *)(long)*local_50;
          if (unaff_R14 != (char *)0x0) {
            pcStack_60 = (code *)0x102d6a;
            ppuVar3 = __ctype_b_loc();
            if ((*(byte *)((long)*ppuVar3 + (long)unaff_R14 * 2 + 1) & 0x20) == 0)
            goto LAB_00102e91;
          }
          filename = filename + 1;
          pcStack_60 = (code *)0x102d8a;
          pcVar2 = strtok((char *)0x0,":");
          pcStack_60 = (code *)0x102d9b;
          unaff_R14 = strtok((char *)0x0," \t");
          lVar8 = lVar8 + 0x10;
          iVar7 = iVar9;
        } while (unaff_R14 != (char *)0x0);
      }
      pcVar2 = local_38;
      if ((int)local_38 < (int)__nptr) {
        pcVar2 = __nptr;
      }
      unaff_R14 = (char *)((ulong)pcVar2 & 0xffffffff);
      if (0.0 <= prob.bias) {
        x_space[(long)filename].value = prob.bias;
        filename = filename + 1;
      }
      pcVar2 = filename + 1;
      x_space[(long)filename].index = -1;
      lVar6 = local_58 + 1;
      filename = pcVar2;
      __stream = local_40;
      unaff_R15 = __nptr;
    } while (lVar6 < prob.l);
  }
  ppfVar1 = prob.x;
  prob.n = (int)unaff_R14;
  if (0.0 <= prob.bias) {
    iVar7 = prob.n + 1;
    prob.n = iVar7;
    if (1 < prob.l) {
      uVar4 = (ulong)(uint)prob.l;
      uVar5 = 1;
      do {
        ppfVar1[uVar5][-2].index = iVar7;
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
    x_space[(long)(pcVar2 + -2)].index = iVar7;
  }
  fclose(__stream);
  return;
}

Assistant:

void read_problem(const char *filename)
{
	int max_index, inst_max_index, i;
	size_t elements, j;
	FILE *fp = fopen(filename,"r");
	char *endptr;
	char *idx, *val, *label;

	if(fp == NULL)
	{
		fprintf(stderr,"can't open input file %s\n",filename);
		exit(1);
	}

	prob.l = 0;
	elements = 0;
	max_line_len = 1024;
	line = Malloc(char,max_line_len);
	while(readline(fp)!=NULL)
	{
		char *p = strtok(line," \t"); // label

		// features
		while(1)
		{
			p = strtok(NULL," \t");
			if(p == NULL || *p == '\n') // check '\n' as ' ' may be after the last feature
				break;
			elements++;
		}
		elements++; // for bias term
		prob.l++;
	}
	rewind(fp);

	prob.bias=bias;

	prob.y = Malloc(double,prob.l);
	prob.x = Malloc(struct feature_node *,prob.l);
	x_space = Malloc(struct feature_node,elements+prob.l);

	max_index = 0;
	j=0;
	for(i=0;i<prob.l;i++)
	{
		inst_max_index = 0; // strtol gives 0 if wrong format
		readline(fp);
		prob.x[i] = &x_space[j];
		label = strtok(line," \t\n");
		if(label == NULL) { // empty line
			exit_input_error(__LINE__, i+1);
		}

		prob.y[i] = strtod(label,&endptr);
		if(endptr == label || *endptr != '\0') {
			exit_input_error(__LINE__, i+1);
		}

		while(1)
		{
			idx = strtok(NULL,":");
			val = strtok(NULL," \t");

			if(val == NULL)
				break;

			errno = 0;
			x_space[j].index = (int) strtol(idx,&endptr,10);
			if(x_space[j].index <= inst_max_index) {
				printf("Error: column index must be ordered : x_space[j].index(%d) inst_max_index(%d)\n", x_space[j].index, inst_max_index) ;
				exit_input_error(__LINE__, i+1);
			} else if(endptr == idx || errno != 0 || *endptr != '\0') {
				exit_input_error(__LINE__, i+1);
			}
			else
				inst_max_index = x_space[j].index;

			errno = 0;
			x_space[j].value = strtod(val,&endptr);
			if(endptr == val || errno != 0 || (*endptr != '\0' && !isspace(*endptr))) {
				exit_input_error(__LINE__, i+1);
			}

			++j;
		}

		if(inst_max_index > max_index)
			max_index = inst_max_index;

		if(prob.bias >= 0)
			x_space[j++].value = prob.bias;

		x_space[j++].index = -1;
	}

	if(prob.bias >= 0)
	{
		prob.n=max_index+1;
		for(i=1;i<prob.l;i++)
			(prob.x[i]-2)->index = prob.n;
		x_space[j-2].index = prob.n;
	}
	else
		prob.n=max_index;

	fclose(fp);
}